

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O1

void SL::WS_LITE::
     ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>
               (shared_ptr<SL::WS_LITE::HubContext> *self,
               shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
               *socket,string *host,string *endpoint,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *extraheaders)

{
  element_type *peVar1;
  basic_streambuf<std::allocator<char>_> *pbVar2;
  result_type rVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ascii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  int c;
  long lVar5;
  __node_base *p_Var6;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> write_buffer;
  string nonce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nonce_base64;
  uniform_int_distribution<unsigned_int> dist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> accept_sha1;
  ostream request;
  random_device rd;
  basic_streambuf<std::allocator<char>_> *local_1598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1590;
  undefined1 *local_1588;
  undefined8 local_1580;
  undefined1 local_1578;
  undefined7 uStack_1577;
  undefined1 local_1568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1558;
  long local_1548 [2];
  element_type *local_1538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1530;
  element_type *local_1528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  param_type local_14f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f0;
  basic_streambuf<std::allocator<char>_> *local_14d0;
  ostream local_14c8 [8];
  ios_base local_14c0 [264];
  random_device local_13b8;
  
  local_1598 = (basic_streambuf<std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::basic_streambuf<std::allocator<char>>,std::allocator<asio::basic_streambuf<std::allocator<char>>>>
            (&local_1590,&local_1598,
             (allocator<asio::basic_streambuf<std::allocator<char>_>_> *)&local_13b8);
  std::ostream::ostream(local_14c8,&local_1598->super_streambuf);
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"GET ",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_14c8,(endpoint->_M_dataplus)._M_p,endpoint->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"Host:",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_14c8,(host->_M_dataplus)._M_p,host->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"Upgrade: websocket\r\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"Connection: Upgrade\r\n",0x15);
  local_1588 = &local_1578;
  local_1580 = 0;
  local_1578 = 0;
  std::__cxx11::string::resize((ulong)&local_1588,'\x10');
  local_14f8._M_a = 0;
  local_14f8._M_b = 0xff;
  std::random_device::random_device(&local_13b8);
  lVar5 = 0;
  do {
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_14f8,&local_13b8,&local_14f8
                      );
    local_1588[lVar5] = (char)rVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  Base64encode<std::__cxx11::string>(&local_1518,(WS_LITE *)&local_1588,ascii);
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"Sec-WebSocket-Key:",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_14c8,local_1518._M_dataplus._M_p,local_1518._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_14c8,"Sec-WebSocket-Version: 13\r\n",0x1b);
  p_Var6 = &(extraheaders->_M_h)._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_14c8,(char *)p_Var6[1]._M_nxt,
                        (long)*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)p_Var6[5]._M_nxt,(long)p_Var6[6]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_14c8,"\r\n",2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1568,
                 &local_1518,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ws_magic_string_abi_cxx11_);
  SHA1<std::__cxx11::string>(&local_14f0,(WS_LITE *)local_1568,input);
  if ((undefined1 *)local_1568._0_8_ != local_1568 + 0x10) {
    operator_delete((void *)local_1568._0_8_,local_1558._M_allocated_capacity + 1);
  }
  pbVar2 = local_1598;
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_1568._0_8_ = local_1598;
  local_1568._8_8_ = local_1590._M_pi;
  if (local_1590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1590._M_pi)->_M_use_count = (local_1590._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1590._M_pi)->_M_use_count = (local_1590._M_pi)->_M_use_count + 1;
    }
  }
  local_1558._M_allocated_capacity = (size_type)local_1548;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1568 + 0x10),local_14f0._M_dataplus._M_p,
             local_14f0._M_dataplus._M_p + local_14f0._M_string_length);
  local_1538 = (socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
  local_1530 = (socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
  if (local_1530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1530->_M_use_count = local_1530->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1530->_M_use_count = local_1530->_M_use_count + 1;
    }
  }
  local_1528 = (self->super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  local_1520 = (self->super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
  if (local_1520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1520->_M_use_count = local_1520->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1520->_M_use_count = local_1520->_M_use_count + 1;
    }
  }
  local_14d0 = pbVar2;
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_all_t,SL::WS_LITE::ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (&peVar1->Socket,&local_14d0,local_1568,0);
  if (local_1520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1520);
  }
  if (local_1530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1530);
  }
  if ((long *)local_1558._M_allocated_capacity != local_1548) {
    operator_delete((void *)local_1558._M_allocated_capacity,local_1548[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1568._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1568._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
    operator_delete(local_14f0._M_dataplus._M_p,local_14f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
    operator_delete(local_1518._M_dataplus._M_p,local_1518.field_2._M_allocated_capacity + 1);
  }
  std::random_device::_M_fini();
  if (local_1588 != &local_1578) {
    operator_delete(local_1588,CONCAT71(uStack_1577,local_1578) + 1);
  }
  std::ios_base::~ios_base(local_14c0);
  if (local_1590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1590._M_pi);
  }
  return;
}

Assistant:

void ConnectHandshake(const std::shared_ptr<HubContext> self, SOCKETTYPE &socket, const std::string &host, const std::string &endpoint,
                          const std::unordered_map<std::string, std::string> &extraheaders)
    {
        auto write_buffer(std::make_shared<asio::streambuf>());
        std::ostream request(write_buffer.get());

        request << "GET " << endpoint << " HTTP/1.1\r\n";
        request << "Host:" << host << "\r\n";
        request << "Upgrade: websocket\r\n";
        request << "Connection: Upgrade\r\n";

        // Make random 16-byte nonce
        std::string nonce;
        nonce.resize(16);
        std::uniform_int_distribution<unsigned int> dist(0, 255);
        std::random_device rd;
        for (int c = 0; c < 16; c++) {
            nonce[c] = static_cast<unsigned char>(dist(rd));
        }

        auto nonce_base64 = Base64encode(nonce);
        request << "Sec-WebSocket-Key:" << nonce_base64 << "\r\n";
        request << "Sec-WebSocket-Version: 13\r\n";
        for (auto &h : extraheaders) {
            request << h.first << ":" << h.second << "\r\n";
        }
        //  request << "" << HTTP_ENDLINE;
        //  request << HTTP_SECWEBSOCKETEXTENSIONS << HTTP_KEYVALUEDELIM << PERMESSAGEDEFLATE << HTTP_ENDLINE;
        request << "\r\n";

        auto accept_sha1 = SHA1(nonce_base64 + ws_magic_string);

        asio::async_write(
            socket->Socket, *write_buffer, [write_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                UNUSED(bytes_transferred);
                if (!ec) {
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Sent Handshake bytes " << bytes_transferred);
                    auto read_buffer(std::make_shared<asio::streambuf>());
                    asio::async_read_until(socket->Socket, *read_buffer, "\r\n\r\n",
                                           [read_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                                               UNUSED(bytes_transferred);
                                               if (!ec) {
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Read Handshake bytes " << bytes_transferred
                                                                                                                          << "  sizeof read_buffer "
                                                                                                                          << read_buffer->size());

                                                   auto header = ParseHeader(asio::buffer_cast<const char *>(read_buffer->data()));
                                                   auto sockey = std::find_if(std::begin(header.Values), std::end(header.Values),
                                                                              [](HeaderKeyValue k) { return k.Key == "Sec-WebSocket-Accept"; });

                                                   if (sockey == std::end(header.Values)) {
                                                       return;
                                                   }
                                                   if (Base64decode(sockey->Value) == accept_sha1) {

                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Connected ");

                                                       socket->SocketStatus_ = SocketStatus::CONNECTED;
                                                       start_ping<false>(socket, std::chrono::seconds(5));
                                                       if (socket->Parent->onConnection) {
                                                           socket->Parent->onConnection(socket, header);
                                                       }
                                                       ReadHeaderStart<false>(socket, read_buffer);
                                                   }
                                                   else {
                                                       socket->SocketStatus_ = SocketStatus::CLOSED;
                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "WebSocket handshake failed  ");
                                                       if (socket->Parent->onDisconnection) {
                                                           socket->Parent->onDisconnection(socket, 1002, "WebSocket handshake failed  ");
                                                       }
                                                   }
                                               }
                                               else {
                                                   socket->SocketStatus_ = SocketStatus::CLOSED;
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "async_read_until failed  " << ec.message());
                                                   if (socket->Parent->onDisconnection) {
                                                       socket->Parent->onDisconnection(socket, 1002, "async_read_until failed  " + ec.message());
                                                   }
                                               }
                                           });
                }
                else {
                    socket->SocketStatus_ = SocketStatus::CLOSED;
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Failed sending handshake" << ec.message());
                    if (socket->Parent->onDisconnection) {
                        socket->Parent->onDisconnection(socket, 1002, "Failed sending handshake" + ec.message());
                    }
                }
            });
    }